

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchCnf.c
# Opt level: O1

void Dch_CollectSuper_rec(Aig_Obj_t *pObj,Vec_Ptr_t *vSuper,int fFirst,int fUseMuxes)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  void **ppvVar4;
  long lVar5;
  
  while ((((((ulong)pObj & 1) == 0 && (((uint)*(ulong *)&pObj->field_0x18 & 7) != 2)) &&
          ((fFirst != 0 || ((*(ulong *)&pObj->field_0x18 & 0xffffff80) == 0)))) &&
         ((fUseMuxes == 0 || (iVar3 = Aig_ObjIsMuxType(pObj), iVar3 == 0))))) {
    fFirst = 0;
    Dch_CollectSuper_rec(pObj->pFanin0,vSuper,0,fUseMuxes);
    pObj = pObj->pFanin1;
  }
  uVar1 = vSuper->nSize;
  if (0 < (long)(int)uVar1) {
    lVar5 = 0;
    do {
      if ((Aig_Obj_t *)vSuper->pArray[lVar5] == pObj) {
        return;
      }
      lVar5 = lVar5 + 1;
    } while ((int)uVar1 != lVar5);
  }
  uVar2 = vSuper->nCap;
  if (uVar1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (vSuper->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(vSuper->pArray,0x80);
      }
      vSuper->pArray = ppvVar4;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar2 * 2;
      if (iVar3 <= (int)uVar2) goto LAB_0092c03c;
      if (vSuper->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(vSuper->pArray,(ulong)uVar2 << 4);
      }
      vSuper->pArray = ppvVar4;
    }
    vSuper->nCap = iVar3;
  }
LAB_0092c03c:
  iVar3 = vSuper->nSize;
  vSuper->nSize = iVar3 + 1;
  vSuper->pArray[iVar3] = pObj;
  return;
}

Assistant:

void Dch_CollectSuper_rec( Aig_Obj_t * pObj, Vec_Ptr_t * vSuper, int fFirst, int fUseMuxes )
{
    // if the new node is complemented or a PI, another gate begins
    if ( Aig_IsComplement(pObj) || Aig_ObjIsCi(pObj) || 
         (!fFirst && Aig_ObjRefs(pObj) > 1) || 
         (fUseMuxes && Aig_ObjIsMuxType(pObj)) )
    {
        Vec_PtrPushUnique( vSuper, pObj );
        return;
    }
    // go through the branches
    Dch_CollectSuper_rec( Aig_ObjChild0(pObj), vSuper, 0, fUseMuxes );
    Dch_CollectSuper_rec( Aig_ObjChild1(pObj), vSuper, 0, fUseMuxes );
}